

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

_Bool black_market_ok(town *town,object *obj)

{
  _Bool _Var1;
  wchar_t wVar2;
  long *local_30;
  object *stock_obj;
  store *store;
  object *obj_local;
  town *town_local;
  
  if (obj->ego == (ego_item *)0x0) {
    if (obj->to_a < 3) {
      if (obj->to_h < 2) {
        if (obj->to_d < 3) {
          wVar2 = object_value_real(obj,L'\x01');
          if (wVar2 < L'\n') {
            town_local._7_1_ = false;
          }
          else {
            for (stock_obj = (object *)town->stores; stock_obj != (object *)0x0;
                stock_obj = (object *)stock_obj->kind) {
              _Var1 = store_is_black_market((store *)stock_obj);
              if ((!_Var1) && (_Var1 = store_is_home((store *)stock_obj), !_Var1)) {
                for (local_30 = *(long **)&(stock_obj->grid).y; local_30 != (long *)0x0;
                    local_30 = (long *)local_30[4]) {
                  if (obj->kind == (object_kind *)*local_30) {
                    return false;
                  }
                }
              }
            }
            town_local._7_1_ = true;
          }
        }
        else {
          town_local._7_1_ = true;
        }
      }
      else {
        town_local._7_1_ = true;
      }
    }
    else {
      town_local._7_1_ = true;
    }
  }
  else {
    town_local._7_1_ = true;
  }
  return town_local._7_1_;
}

Assistant:

static bool black_market_ok(struct town *town, const struct object *obj)
{
	struct store *store;

	/* Ego items are always fine */
	if (obj->ego) return true;

	/* Good items are normally fine */
	if (obj->to_a > 2) return true;
	if (obj->to_h > 1) return true;
	if (obj->to_d > 2) return true;

	/* No cheap items */
	if (object_value_real(obj, 1) < 10) return (false);

	/* Check the other stores */
	for (store = town->stores; store; store = store->next) {
		struct object *stock_obj;

		/* Skip home and black market */
		if (store_is_black_market(store) || store_is_home(store))
			continue;

		/* Check every object in the store */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Compare object kinds */
			if (obj->kind == stock_obj->kind)
				return false;
		}
	}

	/* Otherwise fine */
	return true;
}